

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLinLog>::StairsRenderer
          (StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLinLog> *this,
          GetterYs<signed_char> *getter,TransformerLinLog *transformer,ImU32 col,float weight)

{
  TransformerLinLog *this_00;
  ImVec2 IVar1;
  ImPlotPoint local_40;
  float local_28;
  ImU32 local_24;
  float weight_local;
  ImU32 col_local;
  TransformerLinLog *transformer_local;
  GetterYs<signed_char> *getter_local;
  StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLinLog> *this_local;
  
  this->Getter = getter;
  this->Transformer = transformer;
  this->Prims = this->Getter->Count + -1;
  this->Col = col;
  this->HalfWeight = weight * 0.5;
  local_28 = weight;
  local_24 = col;
  _weight_local = transformer;
  transformer_local = (TransformerLinLog *)getter;
  getter_local = (GetterYs<signed_char> *)this;
  ImVec2::ImVec2(&this->P1);
  this_00 = this->Transformer;
  local_40 = GetterYs<signed_char>::operator()(this->Getter,0);
  IVar1 = TransformerLinLog::operator()(this_00,&local_40);
  this->P1 = IVar1;
  return;
}

Assistant:

inline StairsRenderer(const TGetter& getter, const TTransformer& transformer, ImU32 col, float weight) :
        Getter(getter),
        Transformer(transformer),
        Prims(Getter.Count - 1),
        Col(col),
        HalfWeight(weight * 0.5f)
    {
        P1 = Transformer(Getter(0));
    }